

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O0

QTransform * __thiscall QPainterPrivate::viewTransform(QPainterPrivate *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer pQVar4;
  QTransform *in_RDI;
  double h11;
  double dVar5;
  qreal scaleH;
  qreal scaleW;
  QTransform *in_stack_ffffffffffffffa0;
  
  pQVar4 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                     ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x58d1fa);
  if (((byte)pQVar4->field_0x1a0 >> 1 & 1) == 0) {
    QTransform::QTransform(in_stack_ffffffffffffffa0);
  }
  else {
    pQVar4 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                       ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x58d21e);
    iVar1 = pQVar4->vw;
    pQVar4 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                       ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x58d239);
    h11 = (double)iVar1 / (double)pQVar4->ww;
    pQVar4 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                       ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x58d25e);
    dVar5 = (double)pQVar4->vh;
    pQVar4 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                       ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x58d27a);
    dVar5 = dVar5 / (double)pQVar4->wh;
    pQVar4 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                       ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x58d2b8);
    iVar1 = pQVar4->vx;
    pQVar4 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                       ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x58d2d4);
    iVar2 = pQVar4->wx;
    pQVar4 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                       ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x58d31b);
    iVar3 = pQVar4->vy;
    pQVar4 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                       ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x58d337);
    QTransform::QTransform
              (in_RDI,h11,0.0,0.0,dVar5,-(double)iVar2 * h11 + (double)iVar1,
               -(double)pQVar4->wy * dVar5 + (double)iVar3);
  }
  return in_RDI;
}

Assistant:

QTransform QPainterPrivate::viewTransform() const
{
    if (state->VxF) {
        qreal scaleW = qreal(state->vw)/qreal(state->ww);
        qreal scaleH = qreal(state->vh)/qreal(state->wh);
        return QTransform(scaleW, 0, 0, scaleH,
                          state->vx - state->wx*scaleW, state->vy - state->wy*scaleH);
    }
    return QTransform();
}